

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_ChangeFlag
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  char *pcVar2;
  AActor *actor;
  FString flagname;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_003e7cc9;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    actor = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (actor != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)actor,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003e7cc9;
        }
        goto LAB_003e7c57;
      }
    }
    else if (actor != (AActor *)0x0) goto LAB_003e7cb9;
    actor = (AActor *)0x0;
LAB_003e7c57:
    if (numparam == 1) {
      pcVar2 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\x02') {
        FString::AttachToOther(&flagname,(FString *)(param + 1));
        if ((uint)numparam < 3) {
          pcVar2 = "(paramnum) < numparam";
        }
        else {
          if (param[2].field_0.field_3.Type == '\0') {
            ModActorFlag(actor,&flagname,param[2].field_0.i != 0,true);
            FString::~FString(&flagname);
            return 0;
          }
          pcVar2 = "param[paramnum].Type == REGT_INT";
        }
        __assert_fail(pcVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x11b6,
                      "int AF_AActor_A_ChangeFlag(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pcVar2 = "param[paramnum].Type == REGT_STRING";
    }
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x11b5,
                  "int AF_AActor_A_ChangeFlag(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003e7cb9:
  pcVar2 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003e7cc9:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x11b4,
                "int AF_AActor_A_ChangeFlag(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ChangeFlag)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_STRING	(flagname);
	PARAM_BOOL		(value);

	ModActorFlag(self, flagname, value);
	return 0;
}